

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkConnectionConfig * tonk::SDKSocket::MakeConnectionConfig(SDKConnection *sdkConnection)

{
  _func_void_TonkAppContextPtr_TonkConnection *p_Var1;
  _func_void_TonkAppContextPtr_TonkConnection_uint64_t *p_Var2;
  _func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *p_Var3;
  _func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *p_Var4;
  TonkAppContextPtr in_RSI;
  TonkConnectionConfig_t *in_RDI;
  TonkConnectionConfig *config;
  __3 local_c;
  __2 local_b;
  __1 local_a;
  __0 local_9;
  TonkAppContextPtr local_8;
  
  local_8 = in_RSI;
  TonkConnectionConfig_t::TonkConnectionConfig_t(in_RDI);
  in_RDI->AppContextPtr = local_8;
  p_Var1 = MakeConnectionConfig(tonk::SDKConnection*)::$_0::operator_cast_to_function_pointer
                     (&local_9);
  in_RDI->OnConnect = p_Var1;
  p_Var2 = MakeConnectionConfig(tonk::SDKConnection*)::$_1::operator_cast_to_function_pointer
                     (&local_a);
  in_RDI->OnTick = p_Var2;
  p_Var3 = MakeConnectionConfig(tonk::SDKConnection*)::$_2::operator_cast_to_function_pointer
                     (&local_b);
  in_RDI->OnData = p_Var3;
  p_Var4 = MakeConnectionConfig(tonk::SDKConnection*)::$_3::operator_cast_to_function_pointer
                     (&local_c);
  in_RDI->OnClose = p_Var4;
  return in_RDI;
}

Assistant:

TonkConnectionConfig SDKSocket::MakeConnectionConfig(SDKConnection* sdkConnection)
{
    TonkConnectionConfig config;
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(sdkConnection);

    config.OnConnect = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnConnect();
    };
    config.OnTick = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint64_t nowUsec)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnTick(nowUsec);
    };
    config.OnData = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint32_t channel,
        const uint8_t* data,
        uint32_t bytes)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnData(channel, data, bytes);
    };
    config.OnClose = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        TonkResult reason,
        const char* reasonJson)
    {
        SDKConnection* conn = (SDKConnection*)context;
        SDKJsonResult result;
        result.ErrorJson = reasonJson;
        result.Result = reason;
        conn->OnClose(result);

        // Release self-reference here, allowing object to go out of scope.
        conn->SelfReference.reset();
    };

    return config;
}